

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O1

bool Js::JavascriptLibrary::InitializeSetIteratorPrototype
               (DynamicObject *setIteratorPrototype,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *this;
  ScriptContext *pSVar1;
  undefined8 in_RAX;
  RuntimeFunction *pRVar2;
  StaticType *type;
  LiteralString *pLVar3;
  uint uVar5;
  ulong uVar4;
  
  uVar5 = (uint)((ulong)in_RAX >> 0x20);
  DeferredTypeHandlerBase::Convert(typeHandler,setIteratorPrototype,mode,2,0);
  this = (((setIteratorPrototype->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
  pSVar1 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptSetIterator::EntryInfo::Next,0,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0x107);
  uVar4 = (ulong)uVar5 << 0x20;
  (*(setIteratorPrototype->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (setIteratorPrototype,0x107,pRVar2,6,0,0,uVar4);
  if (((pSVar1->config).threadConfig)->m_ES6ToStringTag == true) {
    type = StringCache::GetStringTypeStatic(&this->stringCache);
    pLVar3 = LiteralString::New(type,L"Set Iterator",0xc,this->recycler);
    (*(setIteratorPrototype->super_RecyclableObject).super_FinalizableObject.
      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
              (setIteratorPrototype,0x1b,pLVar3,2,0,0,uVar4 & 0xffffffff00000000);
  }
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeSetIteratorPrototype(DynamicObject* setIteratorPrototype, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(setIteratorPrototype, mode, 2);
        // Note: Any new function addition/deletion/modification should also be updated in JavascriptLibrary::ProfilerRegisterSetIterator
        // so that the update is in sync with profiler

        JavascriptLibrary* library = setIteratorPrototype->GetLibrary();
        ScriptContext* scriptContext = library->GetScriptContext();
        library->AddFunctionToLibraryObject(setIteratorPrototype, PropertyIds::next, &JavascriptSetIterator::EntryInfo::Next, 0);

        if (scriptContext->GetConfig()->IsES6ToStringTagEnabled())
        {
            library->AddMember(setIteratorPrototype, PropertyIds::_symbolToStringTag, library->CreateStringFromCppLiteral(_u("Set Iterator")), PropertyConfigurable);
        }

        return true;
    }